

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
glcts::AtomicCounterLayoutBindingCase::maxBindings(AtomicCounterLayoutBindingCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  int units;
  int local_c;
  
  local_c = 0;
  iVar1 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x92dc,&local_c);
  return local_c;
}

Assistant:

int maxBindings()
	{
		int units = 0;
		gl().getIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &units);
		return units;
	}